

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.c
# Opt level: O2

void ndn_policy_after_bootstrapping(uint32_t interval)

{
  undefined1 local_4d0 [8];
  ndn_trust_schema_rule_t schema;
  
  ndn_trust_schema_rule_from_strings
            ((ndn_trust_schema_rule_t *)local_4d0,"(<>)<><CMD><>*",0xe,"\\0<KEY><>",9);
  ndn_rule_storage_add_rule("controller-only",(ndn_trust_schema_rule_t *)local_4d0);
  return;
}

Assistant:

void
ndn_policy_after_bootstrapping(uint32_t interval)
{
  // adding existing rules to rule storage
  ndn_trust_schema_rule_t schema;
  ndn_trust_schema_rule_from_strings(&schema, cmd_controller_only_rule_data_name, strlen(cmd_controller_only_rule_data_name),
                                     cmd_controller_only_rule_key_name, strlen(cmd_controller_only_rule_key_name));
  ndn_rule_storage_add_rule("controller-only", &schema);
  //NDN_LOG_INFO("subscribe to policy update\n");
  //ps_subscribe_to_content(NDN_SD_POLICY, "", interval, _on_new_policy, NULL); 
}